

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

StringObject * parse_user_defined_type_name(LexerState *ls,StringObject *type_name)

{
  char *pcVar1;
  CompilerState *compiler_state;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  StringObject *pSVar6;
  char buffer [256];
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined8 uStack_30;
  
  if ((ls->t).token == 0x2e) {
    raviX_next(ls);
    local_68 = 0;
    uStack_60 = 0;
    uStack_58 = 0;
    uStack_50 = 0;
    uStack_48 = 0;
    uStack_40 = 0;
    uStack_38 = 0;
    uStack_30 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    uStack_98 = 0;
    uStack_90 = 0;
    uStack_88 = 0;
    uStack_80 = 0;
    uStack_78 = 0;
    uStack_70 = 0;
    local_e8 = 0;
    uStack_e0 = 0;
    uStack_d8 = 0;
    uStack_d0 = 0;
    uStack_c8 = 0;
    uStack_c0 = 0;
    uStack_b8 = 0;
    uStack_b0 = 0;
    local_128 = 0;
    uStack_120 = 0;
    uStack_118 = 0;
    uStack_110 = 0;
    uStack_108 = 0;
    uStack_100 = 0;
    uStack_f8 = 0;
    uStack_f0 = 0;
    pcVar1 = type_name->str;
    uVar4 = strlen(pcVar1);
    if (uVar4 < 0x100) {
      snprintf((char *)&local_128,0x100,"%s",pcVar1);
      type_name = check_name_and_next(ls);
      pcVar1 = type_name->str;
      sVar5 = strlen(pcVar1);
      uVar3 = uVar4 + 1 + sVar5;
      while (uVar2 = uVar3, uVar2 < 0x100) {
        snprintf((char *)((long)&local_128 + uVar4),0x100 - uVar4,".%s",pcVar1);
        if ((ls->t).token != 0x2e) {
          compiler_state = ls->compiler_state;
          sVar5 = strlen((char *)&local_128);
          pSVar6 = raviX_create_string(compiler_state,(char *)&local_128,(uint32_t)sVar5);
          return pSVar6;
        }
        raviX_next(ls);
        type_name = check_name_and_next(ls);
        pcVar1 = type_name->str;
        sVar5 = strlen(pcVar1);
        uVar4 = uVar2;
        uVar3 = uVar2 + 1 + sVar5;
      }
    }
    raviX_syntaxerror(ls,"User defined type name is too long");
  }
  return type_name;
}

Assistant:

static const StringObject *parse_user_defined_type_name(LexerState *ls,
								const StringObject *type_name)
{
	size_t len = 0;
	if (testnext(ls, '.')) {
		char buffer[256] = {0};
		const char *str = type_name->str;
		len = strlen(str);
		if (len >= sizeof buffer) {
			raviX_syntaxerror(ls, "User defined type name is too long");
			return type_name;
		}
		snprintf(buffer, sizeof buffer, "%s", str);
		do {
			type_name = check_name_and_next(ls);
			str = type_name->str;
			size_t newlen = len + strlen(str) + 1;
			if (newlen >= sizeof buffer) {
				raviX_syntaxerror(ls, "User defined type name is too long");
				return type_name;
			}
			snprintf(buffer + len, sizeof buffer - len, ".%s", str);
			len = newlen;
		} while (testnext(ls, '.'));
		type_name = raviX_create_string(ls->compiler_state, buffer, (uint32_t)strlen(buffer));
	}
	return type_name;
}